

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O1

size_t fiobj_each2(FIOBJ o,_func_int_FIOBJ_void_ptr *task,void *arg)

{
  long lVar1;
  undefined1 uVar2;
  uint uVar3;
  int iVar4;
  fiobj_object_vtable_s *pfVar5;
  size_t sVar6;
  int *piVar7;
  ulong uVar8;
  ulong uVar9;
  fiobj_stack_s stack;
  task_packet_s packet;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  void *pvStack_70;
  _func_int_FIOBJ_void_ptr *local_60;
  void *local_58;
  undefined1 *local_50;
  long local_48;
  size_t local_40;
  undefined2 local_38;
  
  uVar3 = (uint)o & 6;
  if (((uVar3 != 6) && (o != 0)) && ((o & 1) == 0)) {
    switch(uVar3) {
    case 0:
      uVar2 = *(undefined1 *)(o & 0xfffffffffffffff8);
      break;
    case 2:
      uVar2 = 0x28;
      break;
    case 4:
      uVar2 = 0x2a;
      break;
    case 6:
      uVar2 = (undefined1)o;
    }
    switch(uVar2) {
    case 0x27:
      pfVar5 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case 0x28:
      pfVar5 = &FIOBJECT_VTABLE_STRING;
      break;
    case 0x29:
      pfVar5 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case 0x2a:
      pfVar5 = &FIOBJECT_VTABLE_HASH;
      break;
    case 0x2b:
      pfVar5 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar5 = &FIOBJECT_VTABLE_NUMBER;
    }
    if (pfVar5->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0) {
      iVar4 = (*task)(o,arg);
      if (iVar4 == -1) {
        return 1;
      }
      local_78 = 0;
      pvStack_70 = (void *)0x0;
      local_88 = 0;
      uStack_80 = 0;
      local_48 = 0;
      local_40 = 1;
      local_38 = 0;
      sVar6 = 0;
      local_60 = task;
      local_58 = arg;
      local_50 = (undefined1 *)&local_88;
      do {
        if (sVar6 == 0) {
          local_48 = 0;
        }
        local_38 = local_38 & 0xff;
        if (o == 0) {
          uVar2 = 6;
        }
        else {
          uVar2 = 1;
          if ((o & 1) == 0) {
            switch((uint)o & 6) {
            case 0:
              uVar2 = *(undefined1 *)(o & 0xfffffffffffffff8);
              break;
            case 2:
              uVar2 = 0x28;
              break;
            case 4:
              uVar2 = 0x2a;
              break;
            case 6:
              uVar2 = (undefined1)o;
            }
          }
        }
        pfVar5 = &FIOBJECT_VTABLE_NUMBER;
        switch(uVar2) {
        case 0x27:
          pfVar5 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case 0x28:
          pfVar5 = &FIOBJECT_VTABLE_STRING;
          break;
        case 0x29:
          pfVar5 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case 0x2a:
          pfVar5 = &FIOBJECT_VTABLE_HASH;
          break;
        case 0x2b:
          pfVar5 = &FIOBJECT_VTABLE_DATA;
        }
        sVar6 = (*pfVar5->each)(o,sVar6,fiobj_task_wrapper,&local_60);
        if ((char)local_38 != '\0') break;
        if (local_38._1_1_ != '\0') {
          if ((local_78 <= uStack_80) && (local_78 <= uStack_80 + 5)) {
            uVar8 = uStack_80 + 5 & 0xfffffffffffffffe;
            pvStack_70 = fio_realloc2(pvStack_70,uVar8 * 8 + 0x10,uStack_80 << 3);
            if (pvStack_70 == (void *)0x0) goto LAB_001452b0;
            local_78 = uVar8 + 2;
          }
          if (local_88 == uStack_80) {
            local_88 = 0;
            uStack_80 = 0;
          }
          *(size_t *)((long)pvStack_70 + uStack_80 * 8) = sVar6;
          uVar8 = uStack_80 + 1;
          if ((local_78 <= uVar8) && (local_78 <= uStack_80 + 6)) {
            uVar9 = uStack_80 + 6 & 0xfffffffffffffffe;
            uStack_80 = uVar8;
            pvStack_70 = fio_realloc2(pvStack_70,uVar9 * 8 + 0x10,uVar8 * 8);
            if (pvStack_70 == (void *)0x0) goto LAB_001452b0;
            local_78 = uVar9 + 2;
            uVar8 = uStack_80;
          }
          uStack_80 = uVar8;
          if (local_88 == uStack_80) {
            local_88 = 0;
            uStack_80 = 0;
          }
          *(FIOBJ *)((long)pvStack_70 + uStack_80 * 8) = o;
          uStack_80 = uStack_80 + 1;
        }
        if (local_48 != 0) {
          if ((local_78 <= uStack_80) && (local_78 <= uStack_80 + 5)) {
            uVar8 = uStack_80 + 5 & 0xfffffffffffffffe;
            pvStack_70 = fio_realloc2(pvStack_70,uVar8 * 8 + 0x10,uStack_80 << 3);
            if (pvStack_70 == (void *)0x0) goto LAB_001452b0;
            local_78 = uVar8 + 2;
          }
          lVar1 = local_48;
          if (local_88 == uStack_80) {
            local_88 = 0;
            uStack_80 = 0;
          }
          *(undefined8 *)((long)pvStack_70 + uStack_80 * 8) = 0;
          uVar8 = uStack_80 + 1;
          if ((local_78 <= uVar8) && (local_78 <= uStack_80 + 6)) {
            uVar9 = uStack_80 + 6 & 0xfffffffffffffffe;
            uStack_80 = uVar8;
            pvStack_70 = fio_realloc2(pvStack_70,uVar9 * 8 + 0x10,uVar8 * 8);
            if (pvStack_70 == (void *)0x0) {
LAB_001452b0:
              if (0 < FIO_LOG_LEVEL) {
                FIO_LOG2STDERR(
                              "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4920"
                              );
              }
              kill(0,2);
              piVar7 = __errno_location();
              exit(*piVar7);
            }
            local_78 = uVar9 + 2;
            uVar8 = uStack_80;
          }
          uStack_80 = uVar8;
          if (local_88 == uStack_80) {
            local_88 = 0;
            uStack_80 = 0;
          }
          *(long *)((long)pvStack_70 + uStack_80 * 8) = lVar1;
          uStack_80 = uStack_80 + 1;
        }
        if (uStack_80 == local_88) {
          o = 0;
        }
        else {
          o = *(ulong *)((long)pvStack_70 + uStack_80 * 8 + -8);
          uStack_80 = uStack_80 - 1;
        }
        if (uStack_80 != local_88) {
          sVar6 = *(size_t *)((long)pvStack_70 + uStack_80 * 8 + -8);
          uStack_80 = uStack_80 - 1;
        }
      } while (o != 0);
      fio_free(pvStack_70);
      return local_40;
    }
  }
  (*task)(o,arg);
  return 1;
}

Assistant:

size_t fiobj_each2(FIOBJ o, int (*task)(FIOBJ obj, void *arg), void *arg) {
  if (!o || !FIOBJ_IS_ALLOCATED(o) || (FIOBJECT2VTBL(o)->each == NULL)) {
    task(o, arg);
    return 1;
  }
  /* run task for root object */
  if (task(o, arg) == -1)
    return 1;
  uintptr_t pos = 0;
  fiobj_stack_s stack = FIO_ARY_INIT;
  struct task_packet_s packet = {
      .task = task,
      .arg = arg,
      .stack = &stack,
      .counter = 1,
  };
  do {
    if (!pos)
      packet.next = 0;
    packet.incomplete = 0;
    pos = FIOBJECT2VTBL(o)->each(o, pos, fiobj_task_wrapper, &packet);
    if (packet.stop)
      goto finish;
    if (packet.incomplete) {
      fiobj_stack_push(&stack, pos);
      fiobj_stack_push(&stack, o);
    }

    if (packet.next) {
      fiobj_stack_push(&stack, (FIOBJ)0);
      fiobj_stack_push(&stack, packet.next);
    }
    o = FIOBJ_INVALID;
    fiobj_stack_pop(&stack, &o);
    fiobj_stack_pop(&stack, &pos);
  } while (o);
finish:
  fiobj_stack_free(&stack);
  return packet.counter;
}